

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inverse.h
# Opt level: O0

bool Gs::Inverse<float>(AffineMatrix3T<float> *inv,AffineMatrix3T<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float *pfVar5;
  float fVar6;
  float d;
  AffineMatrix3T<float> *m_local;
  AffineMatrix3T<float> *inv_local;
  
  fVar6 = Determinant<float>(m);
  if ((fVar6 != 0.0) || (NAN(fVar6))) {
    fVar6 = 1.0 / fVar6;
    pfVar5 = AffineMatrix3T<float>::At(m,1,1);
    fVar1 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(inv,0,0);
    *pfVar5 = fVar6 * fVar1;
    pfVar5 = AffineMatrix3T<float>::At(m,1,0);
    fVar1 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(inv,1,0);
    *pfVar5 = fVar6 * -fVar1;
    pfVar5 = AffineMatrix3T<float>::At(m,0,1);
    fVar1 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(inv,0,1);
    *pfVar5 = fVar6 * -fVar1;
    pfVar5 = AffineMatrix3T<float>::At(m,0,0);
    fVar1 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(inv,1,1);
    *pfVar5 = fVar6 * fVar1;
    pfVar5 = AffineMatrix3T<float>::At(m,0,1);
    fVar1 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(m,1,2);
    fVar2 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(m,0,2);
    fVar3 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(m,1,1);
    fVar4 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(inv,0,2);
    *pfVar5 = fVar6 * (fVar1 * fVar2 + -(fVar3 * fVar4));
    pfVar5 = AffineMatrix3T<float>::At(m,1,0);
    fVar1 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(m,0,2);
    fVar2 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(m,0,0);
    fVar3 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(m,1,2);
    fVar4 = *pfVar5;
    pfVar5 = AffineMatrix3T<float>::At(inv,1,2);
    *pfVar5 = fVar6 * (fVar1 * fVar2 + -(fVar3 * fVar4));
    inv_local._7_1_ = true;
  }
  else {
    inv_local._7_1_ = false;
  }
  return inv_local._7_1_;
}

Assistant:

bool Inverse(AffineMatrix3T<T>& inv, const AffineMatrix3T<T>& m)
{
    /* Compute inverse determinant */
    T d = Determinant(m);

    if (d == T(0))
        return false;

    d = T(1) / d;

    /* Compute inverse matrix */
    inv.At(0, 0) = d * (  m.At(1, 1) );
    inv.At(1, 0) = d * ( -m.At(1, 0) );
  /*inv.At(2, 0) = 0*/;

    inv.At(0, 1) = d * ( -m.At(0, 1) );
    inv.At(1, 1) = d * (  m.At(0, 0) );
  /*inv.At(2, 1) = 0*/;

    inv.At(0, 2) = d * ( m.At(0, 1) * m.At(1, 2) - m.At(0, 2) * m.At(1, 1) );
    inv.At(1, 2) = d * ( m.At(1, 0) * m.At(0, 2) - m.At(0, 0) * m.At(1, 2) );
  /*inv.At(2, 2) = 1*/;

    return true;
}